

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(ColumnIndex *a,ColumnIndex *b)

{
  long in_RSI;
  vector<long,_true> *in_RDI;
  vector<long,_true> *unaff_retaddr;
  
  std::swap<duckdb::vector<bool,true>>((vector<bool,_true> *)a,(vector<bool,_true> *)b);
  std::swap<duckdb::vector<std::__cxx11::string,true>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)unaff_retaddr,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_RDI);
  std::swap<duckdb::vector<std::__cxx11::string,true>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)unaff_retaddr,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_RDI);
  std::swap<duckdb_parquet::BoundaryOrder::type>((type *)(in_RDI + 4),(type *)(in_RSI + 0x60));
  std::swap<duckdb::vector<long,true>>(unaff_retaddr,in_RDI);
  std::swap<duckdb::vector<long,true>>(unaff_retaddr,in_RDI);
  std::swap<duckdb::vector<long,true>>(unaff_retaddr,in_RDI);
  std::swap<duckdb_parquet::_ColumnIndex__isset>
            ((_ColumnIndex__isset *)
             &in_RDI[7].super_vector<long,_std::allocator<long>_>.
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_finish,(_ColumnIndex__isset *)(in_RSI + 0xb0));
  return;
}

Assistant:

void swap(ColumnIndex &a, ColumnIndex &b) {
  using ::std::swap;
  swap(a.null_pages, b.null_pages);
  swap(a.min_values, b.min_values);
  swap(a.max_values, b.max_values);
  swap(a.boundary_order, b.boundary_order);
  swap(a.null_counts, b.null_counts);
  swap(a.repetition_level_histograms, b.repetition_level_histograms);
  swap(a.definition_level_histograms, b.definition_level_histograms);
  swap(a.__isset, b.__isset);
}